

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void outtab_stream(out_stream_info *stream)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  
  iVar3 = G_os_linewidth;
  if (stream->html_target == 0) {
    iVar1 = stream->os_line_wrap;
    iVar2 = stream->cur_attr;
    bVar6 = stream->linepos;
    bVar4 = stream->linecol;
    do {
      stream->attrbuf[bVar6] = iVar2;
      stream->linebuf[bVar6] = ' ';
      bVar6 = bVar6 + 1;
      bVar5 = bVar4 + 1;
      if ((bVar4 + 2 & 3) == 0) break;
      bVar4 = bVar5;
    } while (iVar1 != 0 || (int)(uint)bVar5 < iVar3);
    stream->linepos = bVar6;
    stream->linecol = bVar5;
  }
  else {
    if (stream->html_mode == 0) {
      outchar_noxlat_stream(stream,'\x19');
      return;
    }
    bVar6 = 0x3c;
    lVar7 = 0;
    do {
      outchar_noxlat_stream(stream,G_cmap_output[bVar6]);
      bVar6 = "<TAB MULTIPLE=4>"[lVar7 + 1];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x10);
  }
  return;
}

Assistant:

static void outtab_stream(out_stream_info *stream)
{
    /* check to see what the underlying system is expecting */
    if (stream->html_target)
    {
        /* the underlying system is HTML - check for HTML mode */
        if (stream->html_mode)
        {
            /* we're in HTML mode, so use the HTML <TAB> tag */
            outstring_stream(stream, "<TAB MULTIPLE=4>");
        }
        else
        {
            /* we're not in HTML mode, so generate a hard tab character */
            outchar_noxlat_stream(stream, QTAB);
        }
    }
    else
    {
        int maxcol;

        /* 
         *   We're not in HTML mode - expand the tab with spaces.  Figure
         *   the maximum column: if we're doing our own line wrapping, never
         *   go beyond the actual display width. 
         */
        maxcol = (stream->os_line_wrap ? OS_MAXWIDTH : G_os_linewidth);

        /* add the spaces */
        do
        {
            stream->attrbuf[stream->linepos] = stream->cur_attr;
            stream->linebuf[stream->linepos++] = ' ';
            ++(stream->linecol);
        } while (((stream->linecol + 1) & 3) != 0
                 && stream->linecol < maxcol);
    }
}